

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O2

bool __thiscall cmParsePHPCoverage::ReadFileInformation(cmParsePHPCoverage *this,istream *in)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *__s;
  long *plVar5;
  bool bVar6;
  cmParsePHPCoverage *this_00;
  long lVar7;
  char c;
  char buf [4];
  string fileName;
  char *local_1c8 [4];
  int local_1a4;
  ostringstream cmCTestLog_msg;
  
  this_00 = (cmParsePHPCoverage *)buf;
  std::istream::read((char *)in,(long)this_00);
  buf[2] = '\0';
  iVar3 = bcmp(this_00,"s:",3);
  if (iVar3 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"failed to read start of file info found: ["
                            );
    poVar4 = std::operator<<(poVar4,buf);
    std::operator<<(poVar4,"]\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x88,fileName._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&fileName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    return false;
  }
  local_1a4 = 0;
  ReadInt(this_00,in,&local_1a4);
  lVar7 = (long)local_1a4;
  __s = (char *)operator_new__(lVar7 + 2);
  plVar5 = (long *)std::istream::get((char *)in);
  if (((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) && (c != '\"')) {
    operator_delete__(__s);
    return false;
  }
  std::istream::read((char *)in,(long)__s);
  __s[lVar7] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileName,__s,(allocator<char> *)&cmCTestLog_msg);
  operator_delete__(__s);
  plVar5 = (long *)std::istream::get((char *)in);
  if (((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) && (c != '\"')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"failed to read close quote\n");
    poVar4 = std::operator<<(poVar4,"read [");
    poVar4 = std::operator<<(poVar4,c);
    std::operator<<(poVar4,"]\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x9e,local_1c8[0],false);
  }
  else {
    bVar2 = ReadCoverageArray(this,in,&fileName);
    bVar6 = true;
    if (bVar2) goto LAB_00170925;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"failed to read coverage array for file: ");
    poVar4 = std::operator<<(poVar4,(string *)&fileName);
    std::operator<<(poVar4,"\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0xa4,local_1c8[0],false);
  }
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar6 = false;
LAB_00170925:
  std::__cxx11::string::~string((string *)&fileName);
  return bVar6;
}

Assistant:

bool cmParsePHPCoverage::ReadFileInformation(std::istream& in)
{
  char buf[4];
  in.read(buf, 2);
  buf[2] = 0;
  if (strcmp(buf, "s:") != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of file info found: [" << buf << "]\n");
    return false;
  }
  char c;
  int size = 0;
  if (this->ReadInt(in, size)) {
    size++; // add one for null termination
    char* s = new char[size + 1];
    // read open quote
    if (in.get(c) && c != '"') {
      delete[] s;
      return false;
    }
    // read the string data
    in.read(s, size - 1);
    s[size - 1] = 0;
    std::string fileName = s;
    delete[] s;
    // read close quote
    if (in.get(c) && c != '"') {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read close quote\n"
                   << "read [" << c << "]\n");
      return false;
    }
    if (!this->ReadCoverageArray(in, fileName)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read coverage array for file: " << fileName
                                                            << "\n");
      return false;
    }
    return true;
  }
  return false;
}